

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void google::protobuf::json_internal::ParseProto3Type::
     SetInt<int,(google::protobuf::Field_Kind)5,(google::protobuf::Field_Kind)15,(google::protobuf::Field_Kind)17>
               (Field f,Msg *msg,int x)

{
  Field_Kind FVar1;
  int32_t iVar2;
  Field *pFVar3;
  uint64_t uVar4;
  uint32_t local_1c;
  int x_local;
  Msg *msg_local;
  Field f_local;
  
  RecordAsSeen(f,msg);
  pFVar3 = ResolverPool::Field::proto(f);
  FVar1 = Field::kind(pFVar3);
  local_1c = x;
  if (FVar1 != Field_Kind_TYPE_INT32) {
    if (FVar1 == Field_Kind_TYPE_SFIXED32) {
      pFVar3 = ResolverPool::Field::proto(f);
      iVar2 = Field::number(pFVar3);
      io::CodedOutputStream::WriteTag(&msg->stream_,iVar2 << 3 | 5);
      io::CodedOutputStream::WriteLittleEndian32(&msg->stream_,x);
      return;
    }
    if (FVar1 != Field_Kind_TYPE_SINT32) {
      return;
    }
    uVar4 = internal::WireFormatLite::ZigZagEncode64((long)x);
    local_1c = (uint32_t)uVar4;
  }
  pFVar3 = ResolverPool::Field::proto(f);
  iVar2 = Field::number(pFVar3);
  io::CodedOutputStream::WriteTag(&msg->stream_,iVar2 << 3);
  io::CodedOutputStream::WriteVarint32(&msg->stream_,local_1c);
  return;
}

Assistant:

static void SetInt(Field f, Msg& msg, Int x) {
    RecordAsSeen(f, msg);
    switch (f->proto().kind()) {
      case zigzag:
        // Regardless of the integer type, ZigZag64 will do the right thing,
        // because ZigZag is not dependent on the width of the integer: it is
        // always `2 * abs(n) + (n < 0)`.
        x = static_cast<Int>(
            internal::WireFormatLite::ZigZagEncode64(static_cast<int64_t>(x)));
        ABSL_FALLTHROUGH_INTENDED;
      case varint:
        msg.stream_.WriteTag(f->proto().number() << 3 |
                             WireFormatLite::WIRETYPE_VARINT);
        if (sizeof(Int) == 4) {
          msg.stream_.WriteVarint32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteVarint64(static_cast<uint64_t>(x));
        }
        break;
      case fixed: {
        if (sizeof(Int) == 4) {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED32);
          msg.stream_.WriteLittleEndian32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED64);
          msg.stream_.WriteLittleEndian64(static_cast<uint64_t>(x));
        }
        break;
      }
      default: {  // Unreachable.
      }
    }
  }